

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerSharedLock(Pager *pPager)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  Pager *in_RDI;
  long in_FS_OFFSET;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  byte bVar22;
  int f;
  sqlite3_vfs *pVfs;
  int rc;
  int fout;
  int bExists;
  int bHotJournal;
  char dbFileVers [16];
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  Pager *in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc8;
  int iVar23;
  uint in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  int iVar24;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar23 = 0;
  if ((in_RDI->pWal == (Wal *)0x0) && (in_RDI->eState == '\0')) {
    iVar24 = 1;
    iVar23 = pager_wait_on_lock(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    if (iVar23 != 0) goto LAB_00169c4e;
    if (in_RDI->eLock < 2) {
      iVar23 = hasHotJournal(in_RDI,(int *)(ulong)in_stack_ffffffffffffffc8);
    }
    if (iVar23 != 0) goto LAB_00169c4e;
    if (iVar24 != 0) {
      if (in_RDI->readOnly != '\0') {
        iVar23 = 0x308;
        goto LAB_00169c4e;
      }
      iVar23 = pagerLockDb(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      if (iVar23 != 0) goto LAB_00169c4e;
      if ((in_RDI->jfd->pMethods == (sqlite3_io_methods *)0x0) && (in_RDI->journalMode != '\x02')) {
        in_stack_ffffffffffffffc0 = (Pager *)in_RDI->pVfs;
        in_stack_ffffffffffffffe0 = -0x55555556;
        iVar23 = sqlite3OsAccess((sqlite3_vfs *)in_RDI,(char *)(ulong)in_stack_ffffffffffffffc8,
                                 (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                                 (int *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8
                                                ));
        if ((iVar23 == 0) && (in_stack_ffffffffffffffe0 != 0)) {
          in_stack_ffffffffffffffdc = 0;
          in_stack_ffffffffffffffbc = 0x802;
          iVar23 = sqlite3OsOpen((sqlite3_vfs *)CONCAT44(iVar24,in_stack_ffffffffffffffe0),
                                 (char *)(ulong)in_stack_ffffffffffffffd8,(sqlite3_file *)in_RDI,0,
                                 (int *)in_stack_ffffffffffffffc0);
          if ((iVar23 == 0) && ((in_stack_ffffffffffffffdc & 1) != 0)) {
            iVar23 = sqlite3CantopenError(0);
            sqlite3OsClose((sqlite3_file *)0x169a7e);
          }
        }
      }
      if (in_RDI->jfd->pMethods == (sqlite3_io_methods *)0x0) {
        if (in_RDI->exclusiveMode == '\0') {
          pagerUnlockDb(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
        }
      }
      else {
        iVar23 = pagerSyncHotJournal(in_stack_ffffffffffffffc0);
        if (iVar23 == 0) {
          iVar23 = pager_playback((Pager *)CONCAT44(iVar24,in_stack_ffffffffffffffe0),
                                  in_stack_ffffffffffffffdc);
          in_RDI->eState = '\0';
        }
      }
      if (iVar23 != 0) {
        pager_error(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
        goto LAB_00169c4e;
      }
    }
    if ((in_RDI->tempFile == '\0') && (in_RDI->hasHeldSharedLock != '\0')) {
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      uStack_10 = &DAT_aaaaaaaaaaaaaaaa;
      iVar23 = sqlite3OsRead((sqlite3_file *)in_RDI,(void *)(ulong)in_stack_ffffffffffffffc8,
                             (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      if (iVar23 != 0) {
        if (iVar23 != 0x20a) goto LAB_00169c4e;
        memset(&local_18,0,0x10);
      }
      cVar7 = -(in_RDI->dbFileVers[0] == (char)local_18);
      cVar8 = -(in_RDI->dbFileVers[1] == local_18._1_1_);
      cVar9 = -(in_RDI->dbFileVers[2] == local_18._2_1_);
      cVar10 = -(in_RDI->dbFileVers[3] == local_18._3_1_);
      cVar11 = -(in_RDI->dbFileVers[4] == local_18._4_1_);
      cVar12 = -(in_RDI->dbFileVers[5] == local_18._5_1_);
      cVar13 = -(in_RDI->dbFileVers[6] == local_18._6_1_);
      cVar14 = -(in_RDI->dbFileVers[7] == local_18._7_1_);
      cVar15 = -(in_RDI->dbFileVers[8] == (char)uStack_10);
      cVar16 = -(in_RDI->dbFileVers[9] == uStack_10._1_1_);
      cVar17 = -(in_RDI->dbFileVers[10] == uStack_10._2_1_);
      cVar18 = -(in_RDI->dbFileVers[0xb] == uStack_10._3_1_);
      cVar19 = -(in_RDI->dbFileVers[0xc] == uStack_10._4_1_);
      cVar20 = -(in_RDI->dbFileVers[0xd] == uStack_10._5_1_);
      cVar21 = -(in_RDI->dbFileVers[0xe] == uStack_10._6_1_);
      bVar22 = -(in_RDI->dbFileVers[0xf] == uStack_10._7_1_);
      auVar1[1] = cVar8;
      auVar1[0] = cVar7;
      auVar1[2] = cVar9;
      auVar1[3] = cVar10;
      auVar1[4] = cVar11;
      auVar1[5] = cVar12;
      auVar1[6] = cVar13;
      auVar1[7] = cVar14;
      auVar1[8] = cVar15;
      auVar1[9] = cVar16;
      auVar1[10] = cVar17;
      auVar1[0xb] = cVar18;
      auVar1[0xc] = cVar19;
      auVar1[0xd] = cVar20;
      auVar1[0xe] = cVar21;
      auVar1[0xf] = bVar22;
      auVar2[1] = cVar8;
      auVar2[0] = cVar7;
      auVar2[2] = cVar9;
      auVar2[3] = cVar10;
      auVar2[4] = cVar11;
      auVar2[5] = cVar12;
      auVar2[6] = cVar13;
      auVar2[7] = cVar14;
      auVar2[8] = cVar15;
      auVar2[9] = cVar16;
      auVar2[10] = cVar17;
      auVar2[0xb] = cVar18;
      auVar2[0xc] = cVar19;
      auVar2[0xd] = cVar20;
      auVar2[0xe] = cVar21;
      auVar2[0xf] = bVar22;
      auVar6[1] = cVar10;
      auVar6[0] = cVar9;
      auVar6[2] = cVar11;
      auVar6[3] = cVar12;
      auVar6[4] = cVar13;
      auVar6[5] = cVar14;
      auVar6[6] = cVar15;
      auVar6[7] = cVar16;
      auVar6[8] = cVar17;
      auVar6[9] = cVar18;
      auVar6[10] = cVar19;
      auVar6[0xb] = cVar20;
      auVar6[0xc] = cVar21;
      auVar6[0xd] = bVar22;
      auVar5[1] = cVar11;
      auVar5[0] = cVar10;
      auVar5[2] = cVar12;
      auVar5[3] = cVar13;
      auVar5[4] = cVar14;
      auVar5[5] = cVar15;
      auVar5[6] = cVar16;
      auVar5[7] = cVar17;
      auVar5[8] = cVar18;
      auVar5[9] = cVar19;
      auVar5[10] = cVar20;
      auVar5[0xb] = cVar21;
      auVar5[0xc] = bVar22;
      auVar4[1] = cVar12;
      auVar4[0] = cVar11;
      auVar4[2] = cVar13;
      auVar4[3] = cVar14;
      auVar4[4] = cVar15;
      auVar4[5] = cVar16;
      auVar4[6] = cVar17;
      auVar4[7] = cVar18;
      auVar4[8] = cVar19;
      auVar4[9] = cVar20;
      auVar4[10] = cVar21;
      auVar4[0xb] = bVar22;
      auVar3[1] = cVar13;
      auVar3[0] = cVar12;
      auVar3[2] = cVar14;
      auVar3[3] = cVar15;
      auVar3[4] = cVar16;
      auVar3[5] = cVar17;
      auVar3[6] = cVar18;
      auVar3[7] = cVar19;
      auVar3[8] = cVar20;
      auVar3[9] = cVar21;
      auVar3[10] = bVar22;
      if (((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1
                    | (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 |
                    (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3 |
                    (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                    (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                    (ushort)((byte)(CONCAT19(bVar22,CONCAT18(cVar21,CONCAT17(cVar20,CONCAT16(cVar19,
                                                  CONCAT15(cVar18,CONCAT14(cVar17,CONCAT13(cVar16,
                                                  CONCAT12(cVar15,CONCAT11(cVar14,cVar13))))))))) >>
                                   7) & 1) << 6 |
                    (ushort)((byte)(CONCAT18(bVar22,CONCAT17(cVar21,CONCAT16(cVar20,CONCAT15(cVar19,
                                                  CONCAT14(cVar18,CONCAT13(cVar17,CONCAT12(cVar16,
                                                  CONCAT11(cVar15,cVar14)))))))) >> 7) & 1) << 7 |
                   (ushort)(bVar22 >> 7) << 0xf) != 0xffff) &&
         (pager_reset((Pager *)0x169bc3), in_RDI->bUseFetch != '\0')) {
        sqlite3OsUnfetch((sqlite3_file *)in_stack_ffffffffffffffc0,
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                         (void *)0x169be3);
      }
    }
    iVar23 = pagerOpenWalIfPresent
                       ((Pager *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  if (in_RDI->pWal != (Wal *)0x0) {
    iVar23 = pagerBeginReadTransaction(in_stack_ffffffffffffffc0);
  }
  if (((in_RDI->tempFile == '\0') && (in_RDI->eState == '\0')) && (iVar23 == 0)) {
    iVar23 = pagerPagecount((Pager *)(ulong)in_stack_ffffffffffffffc8,
                            (Pgno *)in_stack_ffffffffffffffc0);
  }
LAB_00169c4e:
  if (iVar23 == 0) {
    in_RDI->eState = '\x01';
    in_RDI->hasHeldSharedLock = '\x01';
  }
  else {
    pager_unlock(in_stack_ffffffffffffffc0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return iVar23;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerSharedLock(Pager *pPager){
  int rc = SQLITE_OK;                /* Return code */

  /* This routine is only called from b-tree and only when there are no
  ** outstanding pages. This implies that the pager state should either
  ** be OPEN or READER. READER is only possible if the pager is or was in
  ** exclusive access mode.  */
  assert( sqlite3PcacheRefCount(pPager->pPCache)==0 );
  assert( assert_pager_state(pPager) );
  assert( pPager->eState==PAGER_OPEN || pPager->eState==PAGER_READER );
  assert( pPager->errCode==SQLITE_OK );

  if( !pagerUseWal(pPager) && pPager->eState==PAGER_OPEN ){
    int bHotJournal = 1;          /* True if there exists a hot journal-file */

    assert( !MEMDB );
    assert( pPager->tempFile==0 || pPager->eLock==EXCLUSIVE_LOCK );

    rc = pager_wait_on_lock(pPager, SHARED_LOCK);
    if( rc!=SQLITE_OK ){
      assert( pPager->eLock==NO_LOCK || pPager->eLock==UNKNOWN_LOCK );
      goto failed;
    }

    /* If a journal file exists, and there is no RESERVED lock on the
    ** database file, then it either needs to be played back or deleted.
    */
    if( pPager->eLock<=SHARED_LOCK ){
      rc = hasHotJournal(pPager, &bHotJournal);
    }
    if( rc!=SQLITE_OK ){
      goto failed;
    }
    if( bHotJournal ){
      if( pPager->readOnly ){
        rc = SQLITE_READONLY_ROLLBACK;
        goto failed;
      }

      /* Get an EXCLUSIVE lock on the database file. At this point it is
      ** important that a RESERVED lock is not obtained on the way to the
      ** EXCLUSIVE lock. If it were, another process might open the
      ** database file, detect the RESERVED lock, and conclude that the
      ** database is safe to read while this process is still rolling the
      ** hot-journal back.
      **
      ** Because the intermediate RESERVED lock is not requested, any
      ** other process attempting to access the database file will get to
      ** this point in the code and fail to obtain its own EXCLUSIVE lock
      ** on the database file.
      **
      ** Unless the pager is in locking_mode=exclusive mode, the lock is
      ** downgraded to SHARED_LOCK before this function returns.
      */
      rc = pagerLockDb(pPager, EXCLUSIVE_LOCK);
      if( rc!=SQLITE_OK ){
        goto failed;
      }

      /* If it is not already open and the file exists on disk, open the
      ** journal for read/write access. Write access is required because
      ** in exclusive-access mode the file descriptor will be kept open
      ** and possibly used for a transaction later on. Also, write-access
      ** is usually required to finalize the journal in journal_mode=persist
      ** mode (and also for journal_mode=truncate on some systems).
      **
      ** If the journal does not exist, it usually means that some
      ** other connection managed to get in and roll it back before
      ** this connection obtained the exclusive lock above. Or, it
      ** may mean that the pager was in the error-state when this
      ** function was called and the journal file does not exist.
      */
      if( !isOpen(pPager->jfd) && pPager->journalMode!=PAGER_JOURNALMODE_OFF ){
        sqlite3_vfs * const pVfs = pPager->pVfs;
        int bExists;              /* True if journal file exists */
        rc = sqlite3OsAccess(
            pVfs, pPager->zJournal, SQLITE_ACCESS_EXISTS, &bExists);
        if( rc==SQLITE_OK && bExists ){
          int fout = 0;
          int f = SQLITE_OPEN_READWRITE|SQLITE_OPEN_MAIN_JOURNAL;
          assert( !pPager->tempFile );
          rc = sqlite3OsOpen(pVfs, pPager->zJournal, pPager->jfd, f, &fout);
          assert( rc!=SQLITE_OK || isOpen(pPager->jfd) );
          if( rc==SQLITE_OK && fout&SQLITE_OPEN_READONLY ){
            rc = SQLITE_CANTOPEN_BKPT;
            sqlite3OsClose(pPager->jfd);
          }
        }
      }

      /* Playback and delete the journal.  Drop the database write
      ** lock and reacquire the read lock. Purge the cache before
      ** playing back the hot-journal so that we don't end up with
      ** an inconsistent cache.  Sync the hot journal before playing
      ** it back since the process that crashed and left the hot journal
      ** probably did not sync it and we are required to always sync
      ** the journal before playing it back.
      */
      if( isOpen(pPager->jfd) ){
        assert( rc==SQLITE_OK );
        rc = pagerSyncHotJournal(pPager);
        if( rc==SQLITE_OK ){
          rc = pager_playback(pPager, !pPager->tempFile);
          pPager->eState = PAGER_OPEN;
        }
      }else if( !pPager->exclusiveMode ){
        pagerUnlockDb(pPager, SHARED_LOCK);
      }

      if( rc!=SQLITE_OK ){
        /* This branch is taken if an error occurs while trying to open
        ** or roll back a hot-journal while holding an EXCLUSIVE lock. The
        ** pager_unlock() routine will be called before returning to unlock
        ** the file. If the unlock attempt fails, then Pager.eLock must be
        ** set to UNKNOWN_LOCK (see the comment above the #define for
        ** UNKNOWN_LOCK above for an explanation).
        **
        ** In order to get pager_unlock() to do this, set Pager.eState to
        ** PAGER_ERROR now. This is not actually counted as a transition
        ** to ERROR state in the state diagram at the top of this file,
        ** since we know that the same call to pager_unlock() will very
        ** shortly transition the pager object to the OPEN state. Calling
        ** assert_pager_state() would fail now, as it should not be possible
        ** to be in ERROR state when there are zero outstanding page
        ** references.
        */
        pager_error(pPager, rc);
        goto failed;
      }

      assert( pPager->eState==PAGER_OPEN );
      assert( (pPager->eLock==SHARED_LOCK)
           || (pPager->exclusiveMode && pPager->eLock>SHARED_LOCK)
      );
    }

    if( !pPager->tempFile && pPager->hasHeldSharedLock ){
      /* The shared-lock has just been acquired then check to
      ** see if the database has been modified.  If the database has changed,
      ** flush the cache.  The hasHeldSharedLock flag prevents this from
      ** occurring on the very first access to a file, in order to save a
      ** single unnecessary sqlite3OsRead() call at the start-up.
      **
      ** Database changes are detected by looking at 15 bytes beginning
      ** at offset 24 into the file.  The first 4 of these 16 bytes are
      ** a 32-bit counter that is incremented with each change.  The
      ** other bytes change randomly with each file change when
      ** a codec is in use.
      **
      ** There is a vanishingly small chance that a change will not be
      ** detected.  The chance of an undetected change is so small that
      ** it can be neglected.
      */
      char dbFileVers[sizeof(pPager->dbFileVers)];

      IOTRACE(("CKVERS %p %d\n", pPager, sizeof(dbFileVers)));
      rc = sqlite3OsRead(pPager->fd, &dbFileVers, sizeof(dbFileVers), 24);
      if( rc!=SQLITE_OK ){
        if( rc!=SQLITE_IOERR_SHORT_READ ){
          goto failed;
        }
        memset(dbFileVers, 0, sizeof(dbFileVers));
      }

      if( memcmp(pPager->dbFileVers, dbFileVers, sizeof(dbFileVers))!=0 ){
        pager_reset(pPager);

        /* Unmap the database file. It is possible that external processes
        ** may have truncated the database file and then extended it back
        ** to its original size while this process was not holding a lock.
        ** In this case there may exist a Pager.pMap mapping that appears
        ** to be the right size but is not actually valid. Avoid this
        ** possibility by unmapping the db here. */
        if( USEFETCH(pPager) ){
          sqlite3OsUnfetch(pPager->fd, 0, 0);
        }
      }
    }

    /* If there is a WAL file in the file-system, open this database in WAL
    ** mode. Otherwise, the following function call is a no-op.
    */
    rc = pagerOpenWalIfPresent(pPager);
#ifndef SQLITE_OMIT_WAL
    assert( pPager->pWal==0 || rc==SQLITE_OK );
#endif
  }

  if( pagerUseWal(pPager) ){
    assert( rc==SQLITE_OK );
    rc = pagerBeginReadTransaction(pPager);
  }

  if( pPager->tempFile==0 && pPager->eState==PAGER_OPEN && rc==SQLITE_OK ){
    rc = pagerPagecount(pPager, &pPager->dbSize);
  }

 failed:
  if( rc!=SQLITE_OK ){
    assert( !MEMDB );
    pager_unlock(pPager);
    assert( pPager->eState==PAGER_OPEN );
  }else{
    pPager->eState = PAGER_READER;
    pPager->hasHeldSharedLock = 1;
  }
  return rc;
}